

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IntercomCommunicationParameters *this)

{
  ostream *poVar1;
  KINT32 Value;
  string local_1f0 [32];
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IntercomCommunicationParameters *local_18;
  IntercomCommunicationParameters *this_local;
  
  local_18 = this;
  this_local = (IntercomCommunicationParameters *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Intercom Communications Parameter");
  poVar1 = std::operator<<(poVar1,"\nType:     ");
  ENUMS::GetEnumAsStringAdditionalIntrCommParamType_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui16Type,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\nLength:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Length);
  (*this->m_pRecord->_vptr_DataTypeBase[2])(local_1f0);
  std::operator<<(poVar1,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IntercomCommunicationParameters::GetAsString() const
{
    KStringStream ss;

    ss << "Intercom Communications Parameter"
       << "\nType:     " << GetEnumAsStringAdditionalIntrCommParamType( m_ui16Type )
       << "\nLength:   " << m_ui16Length
       << m_pRecord->GetAsString();

    return ss.str();
}